

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O0

void __thiscall
slang::ast::ASTVisitor<slang::ast::DefParamVisitor,_false,_false>::visit<slang::ast::ErrorType>
          (ASTVisitor<slang::ast::DefParamVisitor,_false,_false> *this,ErrorType *t)

{
  ErrorType *t_local;
  ASTVisitor<slang::ast::DefParamVisitor,_false,_false> *this_local;
  
  DefParamVisitor::handle<slang::ast::ErrorType>((DefParamVisitor *)this,t);
  return;
}

Assistant:

void visit(const T& t) {
        if constexpr (is_detected_v<handle_t, TDerived, T>)
            static_cast<TDerived*>(this)->handle(t);
        else if constexpr (is_detected_v<op_t, TDerived, T>)
            (DERIVED)(t);
        else
            visitDefault(t);
    }